

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O3

void divsufsortxx::helper::
     fixdown<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long>
               (iterator Td,iterator SA,long i,long size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  undefined4 extraout_var_01;
  long lVar5;
  undefined4 extraout_var_03;
  long lVar6;
  undefined4 extraout_var_05;
  pos_type pVar7;
  long lVar8;
  BitmapArray<long> *pBVar9;
  pos_type pVar10;
  BitmapArray<long> *pBVar11;
  long lVar12;
  long local_70;
  undefined4 extraout_var_02;
  undefined4 extraout_var_04;
  
  pVar10 = Td.pos_;
  pBVar11 = Td.array_;
  pVar7 = SA.pos_;
  pBVar9 = SA.array_;
  local_70 = i + pVar7;
  iVar1 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9);
  iVar2 = (*(pBVar11->super_Bitmap)._vptr_Bitmap[5])(pBVar11,CONCAT44(extraout_var,iVar1) + pVar10);
  lVar4 = i * 2 + 1;
  if (lVar4 < size) {
    lVar12 = i * 2;
    do {
      iVar3 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9,lVar4 + pVar7);
      iVar3 = (*(pBVar11->super_Bitmap)._vptr_Bitmap[5])
                        (pBVar11,CONCAT44(extraout_var_01,iVar3) + pVar10);
      lVar5 = CONCAT44(extraout_var_02,iVar3);
      iVar3 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9,pVar7 + lVar12 + 2);
      iVar3 = (*(pBVar11->super_Bitmap)._vptr_Bitmap[5])
                        (pBVar11,CONCAT44(extraout_var_03,iVar3) + pVar10);
      lVar6 = CONCAT44(extraout_var_04,iVar3);
      lVar8 = lVar5;
      if (lVar5 <= lVar6) {
        lVar8 = lVar6;
      }
      if (lVar8 <= CONCAT44(extraout_var_00,iVar2)) {
        local_70 = i + pVar7;
        break;
      }
      lVar8 = lVar4;
      if (lVar5 < lVar6) {
        lVar8 = lVar12 + 2;
      }
      local_70 = lVar8 + pVar7;
      iVar3 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9);
      (*(pBVar9->super_Bitmap)._vptr_Bitmap[4])(pBVar9,i + pVar7,CONCAT44(extraout_var_05,iVar3));
      lVar12 = lVar8 * 2;
      lVar4 = lVar8 * 2 + 1;
      i = lVar8;
    } while (lVar4 < size);
  }
  (*(pBVar9->super_Bitmap)._vptr_Bitmap[4])(pBVar9,local_70,CONCAT44(extraout_var,iVar1));
  return;
}

Assistant:

void fixdown(const StringIterator_type Td, SAIterator_type SA, pos_type i,
             pos_type size) {
  typedef typename std::iterator_traits<StringIterator_type>::value_type value_type;
  pos_type j, k, t;
  value_type c, d, e;

  for (t = SA[i], c = Td[t]; (j = 2 * i + 1) < size; SA[i] = SA[k], i = k) {
    d = Td[SA[k = j++]];
    if (d < (e = Td[SA[j]])) {
      k = j;
      d = e;
    }
    if (d <= c) {
      break;
    }
  }
  SA[i] = t;
}